

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter.cpp
# Opt level: O0

char * QUtf8::convertFromUnicode(char *dst,QStringView in)

{
  undefined8 uVar1;
  undefined8 uVar2;
  char16_t cVar3;
  char cVar4;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [12];
  ushort n_00;
  qsizetype qVar22;
  const_pointer pvVar23;
  anon_class_32_4_99005a4f *in_RDI;
  long in_FS_OFFSET;
  int res;
  char16_t u;
  char16_t *end;
  qsizetype len;
  uchar n_3;
  __m128i nonAscii_1;
  __m128i packed_1;
  __m128i data2_1;
  __m128i data1;
  uchar n_2;
  __m128i nonAscii;
  __m128i packed;
  __m128i data2;
  __m128i data;
  ushort n;
  ushort n_1;
  qptrdiff offset;
  size_t Step;
  size_t size_1;
  size_t size;
  char16_t *nextAscii;
  char16_t *src;
  uchar *dst_1;
  anon_class_32_4_847b04ed adjustToEnd;
  anon_class_32_4_99005a4f maybeFoundNonAscii;
  anon_class_1_0_00000001 process16Chars;
  size_t sizeBytes;
  char16_t *in_stack_fffffffffffffbb8;
  undefined4 in_stack_fffffffffffffbc0;
  uint in_stack_fffffffffffffbc4;
  undefined4 in_stack_fffffffffffffbc8;
  ushort in_stack_fffffffffffffbcc;
  undefined1 in_stack_fffffffffffffbce;
  uchar in_stack_fffffffffffffbcf;
  anon_class_32_4_99005a4f *this;
  undefined8 local_3f8;
  undefined4 uStack_3f0;
  undefined4 local_3e8;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  long local_358;
  bool local_329;
  short local_248;
  short sStack_246;
  short sStack_244;
  short sStack_242;
  short sStack_240;
  short sStack_23e;
  short sStack_23c;
  short sStack_23a;
  short local_228;
  short sStack_226;
  short sStack_224;
  short sStack_222;
  short sStack_220;
  short sStack_21e;
  short sStack_21c;
  short sStack_21a;
  short local_208;
  short sStack_206;
  short sStack_204;
  short sStack_202;
  short local_1e8;
  short sStack_1e6;
  short sStack_1e4;
  short sStack_1e2;
  undefined1 local_b1 [33];
  const_pointer local_90;
  const_pointer local_88;
  anon_class_32_4_99005a4f *local_80;
  QStringView local_78;
  anon_class_32_4_847b04ed local_68;
  const_pointer *local_48;
  anon_class_32_4_99005a4f **local_40;
  const_pointer *local_38;
  const_pointer *local_30;
  anon_class_1_0_00000001 local_21;
  ulong local_20;
  const_pointer local_18;
  undefined4 local_10;
  undefined4 local_c;
  long local_8;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  qVar22 = QStringView::size(&local_78);
  local_80 = in_RDI;
  local_88 = QStringView::data(&local_78);
  pvVar23 = local_88 + qVar22;
  while (local_88 != pvVar23) {
    local_68.dst = (uchar **)&local_80;
    local_38 = &local_90;
    local_68.src = (char16_t **)&local_88;
    local_20 = (long)pvVar23 - (long)local_88;
    local_21 = (anon_class_1_0_00000001)0xaa;
    local_30 = &local_18;
    local_68.sizeBytes = &local_20;
    local_68.end = (char16_t **)&local_18;
    local_90 = pvVar23;
    local_48 = (const_pointer *)local_68.src;
    local_40 = (anon_class_32_4_99005a4f **)local_68.dst;
    local_18 = pvVar23;
    if (local_20 < 0x20) {
      if (local_20 < 0x10) {
        if (local_20 < 8) {
          local_329 = local_88 == pvVar23;
        }
        else {
          uVar1 = *(undefined8 *)local_88;
          uVar2 = *(undefined8 *)(pvVar23 + -4);
          local_1e8 = (short)uVar1;
          sStack_1e6 = (short)((ulong)uVar1 >> 0x10);
          sStack_1e4 = (short)((ulong)uVar1 >> 0x20);
          sStack_1e2 = (short)((ulong)uVar1 >> 0x30);
          cVar9 = (0 < local_1e8) * (local_1e8 < 0x100) * (char)uVar1 - (0xff < local_1e8);
          cVar8 = (char)((ulong)uVar1 >> 0x10);
          cVar10 = (0 < sStack_1e6) * (sStack_1e6 < 0x100) * cVar8 - (0xff < sStack_1e6);
          cVar7 = (char)((ulong)uVar1 >> 0x20);
          cVar11 = (0 < sStack_1e4) * (sStack_1e4 < 0x100) * cVar7 - (0xff < sStack_1e4);
          cVar6 = (char)((ulong)uVar1 >> 0x30);
          cVar5 = (0 < sStack_1e2) * (sStack_1e2 < 0x100) * cVar6 - (0xff < sStack_1e2);
          local_3e8._0_2_ = CONCAT11(cVar10,cVar9);
          local_3e8._0_3_ = CONCAT12(cVar11,(undefined2)local_3e8);
          local_3e8 = CONCAT13(cVar5,(undefined3)local_3e8);
          local_3f8 = CONCAT44(0,CONCAT13(-('\0' < cVar5),
                                          CONCAT12(-('\0' < cVar11),
                                                   CONCAT11(-('\0' < cVar10),-('\0' < cVar9)))));
          uStack_3f0 = CONCAT13(-('\0' < (char)((0 < sStack_1e2) * (sStack_1e2 < 0x100) * cVar6 -
                                               (0xff < sStack_1e2))),
                                CONCAT12(-('\0' < (char)((0 < sStack_1e4) * (sStack_1e4 < 0x100) *
                                                         cVar7 - (0xff < sStack_1e4))),
                                         CONCAT11(-('\0' < (char)((0 < sStack_1e6) *
                                                                  (sStack_1e6 < 0x100) * cVar8 -
                                                                 (0xff < sStack_1e6))),
                                                  -('\0' < (char)((0 < local_1e8) *
                                                                  (local_1e8 < 0x100) * (char)uVar1
                                                                 - (0xff < local_1e8))))));
          local_c = local_3e8;
          *(undefined4 *)&local_80->src = local_3e8;
          auVar21._8_4_ = uStack_3f0;
          auVar21._0_8_ = local_3f8;
          if ((byte)(SUB121(auVar21 >> 7,0) & 1 | (SUB121(auVar21 >> 0xf,0) & 1) << 1 |
                     (SUB121(auVar21 >> 0x17,0) & 1) << 2 | SUB121(auVar21 >> 0x1f,0) << 3) == 0xf)
          {
            simdEncodeAscii<1UL>::anon_class_32_4_847b04ed::operator()(&local_68);
            local_208 = (short)uVar2;
            sStack_206 = (short)((ulong)uVar2 >> 0x10);
            sStack_204 = (short)((ulong)uVar2 >> 0x20);
            sStack_202 = (short)((ulong)uVar2 >> 0x30);
            local_3e8._0_2_ =
                 CONCAT11((0 < sStack_206) * (sStack_206 < 0x100) * (char)((ulong)uVar2 >> 0x10) -
                          (0xff < sStack_206),
                          (0 < local_208) * (local_208 < 0x100) * (char)uVar2 - (0xff < local_208));
            local_3e8._0_3_ =
                 CONCAT12((0 < sStack_204) * (sStack_204 < 0x100) * (char)((ulong)uVar2 >> 0x20) -
                          (0xff < sStack_204),(undefined2)local_3e8);
            local_3e8 = CONCAT13((0 < sStack_202) * (sStack_202 < 0x100) *
                                 (char)((ulong)uVar2 >> 0x30) - (0xff < sStack_202),
                                 (undefined3)local_3e8);
            local_10 = local_3e8;
            *(undefined4 *)((long)&local_80[-1].end + 4) = local_3e8;
            local_329 = simdEncodeAscii<1ul>(unsigned_char*&,char16_t_const*&,char16_t_const*&,char16_t_const*)
                        ::{lambda(auto:1,long_long)#1}::operator()
                                  (this,in_stack_fffffffffffffbcf,
                                   CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0));
          }
          else {
            local_329 = simdEncodeAscii<1ul>(unsigned_char*&,char16_t_const*&,char16_t_const*&,char16_t_const*)
                        ::{lambda(auto:1,long_long)#1}::operator()
                                  (this,in_stack_fffffffffffffbcf,
                                   CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0));
          }
        }
      }
      else {
        uVar1 = *(undefined8 *)local_88;
        uVar2 = *(undefined8 *)(local_88 + 4);
        uVar18 = *(undefined8 *)(pvVar23 + -8);
        uVar19 = *(undefined8 *)(pvVar23 + -4);
        local_228 = (short)uVar1;
        sStack_226 = (short)((ulong)uVar1 >> 0x10);
        sStack_224 = (short)((ulong)uVar1 >> 0x20);
        sStack_222 = (short)((ulong)uVar1 >> 0x30);
        sStack_220 = (short)uVar2;
        sStack_21e = (short)((ulong)uVar2 >> 0x10);
        sStack_21c = (short)((ulong)uVar2 >> 0x20);
        sStack_21a = (short)((ulong)uVar2 >> 0x30);
        cVar4 = (0 < local_228) * (local_228 < 0x100) * (char)uVar1 - (0xff < local_228);
        cVar12 = (char)((ulong)uVar1 >> 0x10);
        cVar5 = (0 < sStack_226) * (sStack_226 < 0x100) * cVar12 - (0xff < sStack_226);
        cVar13 = (char)((ulong)uVar1 >> 0x20);
        cVar6 = (0 < sStack_224) * (sStack_224 < 0x100) * cVar13 - (0xff < sStack_224);
        cVar14 = (char)((ulong)uVar1 >> 0x30);
        cVar7 = (0 < sStack_222) * (sStack_222 < 0x100) * cVar14 - (0xff < sStack_222);
        cVar8 = (0 < sStack_220) * (sStack_220 < 0x100) * (char)uVar2 - (0xff < sStack_220);
        cVar15 = (char)((ulong)uVar2 >> 0x10);
        cVar9 = (0 < sStack_21e) * (sStack_21e < 0x100) * cVar15 - (0xff < sStack_21e);
        cVar16 = (char)((ulong)uVar2 >> 0x20);
        cVar10 = (0 < sStack_21c) * (sStack_21c < 0x100) * cVar16 - (0xff < sStack_21c);
        cVar17 = (char)((ulong)uVar2 >> 0x30);
        cVar11 = (0 < sStack_21a) * (sStack_21a < 0x100) * cVar17 - (0xff < sStack_21a);
        local_398._0_2_ = CONCAT11(cVar5,cVar4);
        local_398._0_3_ = CONCAT12(cVar6,(undefined2)local_398);
        local_398._0_4_ = CONCAT13(cVar7,(undefined3)local_398);
        local_398._0_5_ = CONCAT14(cVar8,(undefined4)local_398);
        local_398._0_6_ = CONCAT15(cVar9,(undefined5)local_398);
        local_398._0_7_ = CONCAT16(cVar10,(undefined6)local_398);
        local_398 = (char16_t **)CONCAT17(cVar11,(undefined7)local_398);
        local_3a8 = CONCAT17(-('\0' < cVar11),
                             CONCAT16(-('\0' < cVar10),
                                      CONCAT15(-('\0' < cVar9),
                                               CONCAT14(-('\0' < cVar8),
                                                        CONCAT13(-('\0' < cVar7),
                                                                 CONCAT12(-('\0' < cVar6),
                                                                          CONCAT11(-('\0' < cVar5),
                                                                                   -('\0' < cVar4)))
                                                                )))));
        uStack_3a0 = CONCAT17(-('\0' < (char)((0 < sStack_21a) * (sStack_21a < 0x100) * cVar17 -
                                             (0xff < sStack_21a))),
                              CONCAT16(-('\0' < (char)((0 < sStack_21c) * (sStack_21c < 0x100) *
                                                       cVar16 - (0xff < sStack_21c))),
                                       CONCAT15(-('\0' < (char)((0 < sStack_21e) *
                                                                (sStack_21e < 0x100) * cVar15 -
                                                               (0xff < sStack_21e))),
                                                CONCAT14(-('\0' < (char)((0 < sStack_220) *
                                                                         (sStack_220 < 0x100) *
                                                                         (char)uVar2 -
                                                                        (0xff < sStack_220))),
                                                         CONCAT13(-('\0' < (char)((0 < sStack_222) *
                                                                                  (sStack_222 <
                                                                                  0x100) * cVar14 -
                                                                                 (0xff < sStack_222)
                                                                                 )),
                                                                  CONCAT12(-('\0' < (char)((0 < 
                                                  sStack_224) * (sStack_224 < 0x100) * cVar13 -
                                                  (0xff < sStack_224))),
                                                  CONCAT11(-('\0' < (char)((0 < sStack_226) *
                                                                           (sStack_226 < 0x100) *
                                                                           cVar12 - (0xff < 
                                                  sStack_226))),
                                                  -('\0' < (char)((0 < local_228) *
                                                                  (local_228 < 0x100) * (char)uVar1
                                                                 - (0xff < local_228))))))))));
        local_80->src = local_398;
        auVar20._8_8_ = uStack_3a0;
        auVar20._0_8_ = local_3a8;
        if ((byte)(SUB161(auVar20 >> 7,0) & 1 | (SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                   (SUB161(auVar20 >> 0x17,0) & 1) << 2 | (SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                   (SUB161(auVar20 >> 0x27,0) & 1) << 4 | (SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                   (SUB161(auVar20 >> 0x37,0) & 1) << 6 | SUB161(auVar20 >> 0x3f,0) << 7) == 0xff) {
          simdEncodeAscii<1UL>::anon_class_32_4_847b04ed::operator()(&local_68);
          local_248 = (short)uVar18;
          sStack_246 = (short)((ulong)uVar18 >> 0x10);
          sStack_244 = (short)((ulong)uVar18 >> 0x20);
          sStack_242 = (short)((ulong)uVar18 >> 0x30);
          sStack_240 = (short)uVar19;
          sStack_23e = (short)((ulong)uVar19 >> 0x10);
          sStack_23c = (short)((ulong)uVar19 >> 0x20);
          sStack_23a = (short)((ulong)uVar19 >> 0x30);
          local_398._0_2_ =
               CONCAT11((0 < sStack_246) * (sStack_246 < 0x100) * (char)((ulong)uVar18 >> 0x10) -
                        (0xff < sStack_246),
                        (0 < local_248) * (local_248 < 0x100) * (char)uVar18 - (0xff < local_248));
          local_398._0_3_ =
               CONCAT12((0 < sStack_244) * (sStack_244 < 0x100) * (char)((ulong)uVar18 >> 0x20) -
                        (0xff < sStack_244),(undefined2)local_398);
          local_398._0_4_ =
               CONCAT13((0 < sStack_242) * (sStack_242 < 0x100) * (char)((ulong)uVar18 >> 0x30) -
                        (0xff < sStack_242),(undefined3)local_398);
          local_398._0_5_ =
               CONCAT14((0 < sStack_240) * (sStack_240 < 0x100) * (char)uVar19 - (0xff < sStack_240)
                        ,(undefined4)local_398);
          local_398._0_6_ =
               CONCAT15((0 < sStack_23e) * (sStack_23e < 0x100) * (char)((ulong)uVar19 >> 0x10) -
                        (0xff < sStack_23e),(undefined5)local_398);
          local_398._0_7_ =
               CONCAT16((0 < sStack_23c) * (sStack_23c < 0x100) * (char)((ulong)uVar19 >> 0x20) -
                        (0xff < sStack_23c),(undefined6)local_398);
          local_398 = (char16_t **)
                      CONCAT17((0 < sStack_23a) * (sStack_23a < 0x100) *
                               (char)((ulong)uVar19 >> 0x30) - (0xff < sStack_23a),
                               (undefined7)local_398);
          local_80[-1].end = local_398;
          local_329 = simdEncodeAscii<1ul>(unsigned_char*&,char16_t_const*&,char16_t_const*&,char16_t_const*)
                      ::{lambda(auto:1,long_long)#1}::operator()
                                (this,in_stack_fffffffffffffbcf,
                                 CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0));
        }
        else {
          local_329 = simdEncodeAscii<1ul>(unsigned_char*&,char16_t_const*&,char16_t_const*&,char16_t_const*)
                      ::{lambda(auto:1,long_long)#1}::operator()
                                (this,in_stack_fffffffffffffbcf,
                                 CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0));
        }
      }
    }
    else {
      for (local_358 = 0; (ulong)((local_358 + 0x10) * 2) < local_20; local_358 = local_358 + 0x10)
      {
        n_00 = simdEncodeAscii<1UL>::anon_class_1_0_00000001::operator()
                         (&local_21,(uchar *)((long)&local_80->src + local_358),
                          &local_88[local_358].ucs);
        in_stack_fffffffffffffbce = (undefined1)n_00;
        in_stack_fffffffffffffbcf = (uchar)(n_00 >> 8);
        if (n_00 != 0) {
          local_329 = simdEncodeAscii<1ul>(unsigned_char*&,char16_t_const*&,char16_t_const*&,char16_t_const*)
                      ::{lambda(auto:1,long_long)#1}::operator()
                                (this,n_00,
                                 CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0));
          goto LAB_0053e6ac;
        }
      }
      simdEncodeAscii<1UL>::anon_class_32_4_847b04ed::operator()(&local_68);
      in_stack_fffffffffffffbcc =
           simdEncodeAscii<1UL>::anon_class_1_0_00000001::operator()
                     (&local_21,(uchar *)&local_80[-1].nextAscii,&local_88[-0x10].ucs);
      local_329 = simdEncodeAscii<1ul>(unsigned_char*&,char16_t_const*&,char16_t_const*&,char16_t_const*)
                  ::{lambda(auto:1,long_long)#1}::operator()
                            (this,CONCAT11(in_stack_fffffffffffffbcf,in_stack_fffffffffffffbce),
                             CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0));
    }
LAB_0053e6ac:
    in_stack_fffffffffffffbc8 = CONCAT13(local_329,(int3)in_stack_fffffffffffffbc8);
    if (local_329 != false) break;
    do {
      cVar3 = local_88->ucs;
      local_88 = local_88 + 1;
      in_stack_fffffffffffffbc4 =
           QUtf8Functions::toUtf8<QUtf8BaseTraits,unsigned_char*,char16_t_const*>
                     ((char16_t)((ulong)this >> 0x10),
                      (uchar **)
                      CONCAT17(in_stack_fffffffffffffbcf,
                               CONCAT16(in_stack_fffffffffffffbce,
                                        CONCAT24(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8
                                                ))),
                      (char16_t **)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                      in_stack_fffffffffffffbb8);
      if ((int)in_stack_fffffffffffffbc4 < 0) {
        convertFromUnicode(char*,QStringView)::$_0::operator()
                  (local_b1,(uchar *)local_80,(ulong)(ushort)cVar3,(ulong)in_stack_fffffffffffffbc4)
        ;
      }
    } while (local_88 < local_90);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (char *)local_80;
}

Assistant:

char *QUtf8::convertFromUnicode(char *dst, QStringView in) noexcept
{
    return convertFromUnicode(dst, in, [](auto *dst, ...) {
        // encoding error - append '?'
        *dst++ = '?';
    });
}